

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::AddSubdiagonalValues(Codec *this)

{
  ushort uVar1;
  uint uVar2;
  PeelColumn *pPVar3;
  uint64_t *puVar4;
  uint16_t *puVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  uint8_t *puVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint uVar17;
  long lVar19;
  int iVar20;
  uint uVar21;
  uint ge_below_i;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint8_t *vx;
  ushort *puVar25;
  uint bit_j;
  ulong uVar26;
  ulong uVar27;
  uint8_t *win_table [128];
  undefined8 uStack_38;
  ulong uVar18;
  
  uVar11 = 0;
  uVar12 = (uint)this->_mix_count + (uint)this->_defer_count;
  uVar13 = this->_dense_count + this->_defer_count;
  if (0x45 < uVar12) {
    uVar7 = this->_extra_count + uVar13;
    iVar10 = -0x46;
    if (uVar12 >= 0x5b) {
      iVar10 = -0x5b;
    }
    iVar20 = -0x91;
    if (uVar12 < 0x91) {
      iVar20 = iVar10;
    }
    uVar17 = 7;
    if (uVar12 < 0x91) {
      uVar17 = 6 - (uVar12 < 0x5b);
    }
    uVar21 = iVar20 + uVar12;
    uVar8 = 1;
    uVar1 = this->_block_count;
    pPVar3 = this->_peel_cols;
    puVar14 = this->_recovery_blocks;
    uVar9 = this->_block_bytes;
    uVar23 = 1 << (uVar17 & 0x1f);
    for (lVar19 = 0; (uint)uVar1 * 6 != (int)lVar19; lVar19 = lVar19 + 6) {
      if ((&pPVar3->Mark)[lVar19] == '\x01') {
        uVar11 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        win_table[uVar11] = puVar14;
        if (uVar23 <= uVar8) break;
      }
      puVar14 = puVar14 + uVar9;
    }
    uVar11 = 0;
    if (uVar23 <= uVar8) {
      uVar11 = 0;
      do {
        uVar18 = uVar11;
        do {
          uVar9 = (uint)uVar18;
          uVar22 = (uVar9 - 1) + uVar17;
          uVar8 = uVar9 + uVar17;
          uVar11 = (ulong)uVar8;
          uVar26 = (ulong)(uVar9 & 0x3f);
          uVar27 = 1L << uVar26;
          uVar15 = uVar18;
          while( true ) {
            puVar14 = this->_recovery_blocks;
            uVar2 = this->_block_bytes;
            puVar5 = this->_ge_col_map;
            if (uVar22 <= uVar15) break;
            uVar1 = puVar5[uVar15];
            uVar6 = uVar15 >> 6;
            uVar15 = uVar15 + 1;
            puVar4 = this->_ge_matrix;
            for (uVar24 = uVar15 & 0xffffffff; (uint)uVar24 <= uVar22;
                uVar24 = (ulong)((uint)uVar24 + 1)) {
              if ((*(ulong *)((long)puVar4 +
                             (ulong)((uint)this->_pivots[uVar24] * this->_ge_pitch) * 8 +
                             (ulong)(((uint)uVar6 & 0x3ffffff) << 3)) & uVar27) != 0) {
                gf256_add_mem(this->_recovery_blocks +
                              (uint)this->_ge_col_map[uVar24] * this->_block_bytes,
                              puVar14 + uVar2 * uVar1,this->_block_bytes);
              }
            }
            uVar27 = uVar27 >> 0x3f | uVar27 << 1;
          }
          vx = puVar14 + puVar5[uVar18] * uVar2;
          puVar14 = puVar14 + puVar5[uVar9 + 1] * uVar2;
          win_table[1] = vx;
          win_table[2] = puVar14;
          gf256_addset_mem(win_table[3],vx,puVar14,uVar2);
          puVar16 = this->_recovery_blocks + (uint)this->_ge_col_map[uVar9 + 2] * this->_block_bytes
          ;
          win_table[4] = puVar16;
          gf256_addset_mem(win_table[5],vx,puVar16,this->_block_bytes);
          gf256_addset_mem(win_table[6],puVar14,puVar16,this->_block_bytes);
          gf256_addset_mem(win_table[7],vx,win_table[6],this->_block_bytes);
          uVar1 = this->_ge_col_map[uVar9 + 3];
          uVar2 = this->_block_bytes;
          puVar14 = this->_recovery_blocks;
          win_table[8] = puVar14 + uVar1 * uVar2;
          for (lVar19 = -0x38; lVar19 != 0; lVar19 = lVar19 + 8) {
            gf256_addset_mem(*(void **)((long)win_table + lVar19 + 0x80),
                             *(void **)((long)win_table + lVar19 + 0x40),puVar14 + uVar1 * uVar2,
                             this->_block_bytes);
          }
          if (4 < uVar17) {
            uVar1 = this->_ge_col_map[uVar9 + 4];
            uVar2 = this->_block_bytes;
            puVar14 = this->_recovery_blocks;
            win_table[0x10] = puVar14 + uVar1 * uVar2;
            for (lVar19 = -0x78; lVar19 != 0; lVar19 = lVar19 + 8) {
              gf256_addset_mem(*(void **)((long)win_table + lVar19 + 0x100),
                               *(void **)((long)win_table + lVar19 + 0x80),puVar14 + uVar1 * uVar2,
                               this->_block_bytes);
            }
            if (uVar17 != 5) {
              uVar1 = this->_ge_col_map[uVar9 + 5];
              uVar2 = this->_block_bytes;
              puVar14 = this->_recovery_blocks;
              win_table[0x20] = puVar14 + uVar1 * uVar2;
              for (lVar19 = -0xf8; lVar19 != 0; lVar19 = lVar19 + 8) {
                gf256_addset_mem(*(void **)((long)win_table + lVar19 + 0x200),
                                 *(void **)((long)win_table + lVar19 + 0x100),
                                 puVar14 + uVar1 * uVar2,this->_block_bytes);
              }
              if (6 < uVar17) {
                uVar1 = this->_ge_col_map[uVar9 + 6];
                uVar2 = this->_block_bytes;
                puVar14 = this->_recovery_blocks;
                win_table[0x40] = puVar14 + uVar1 * uVar2;
                for (lVar19 = -0x1f8; lVar19 != 0; lVar19 = lVar19 + 8) {
                  gf256_addset_mem(*(void **)((long)&uStack_38 + lVar19),
                                   *(void **)((long)win_table + lVar19 + 0x200),
                                   puVar14 + uVar1 * uVar2,this->_block_bytes);
                }
              }
            }
          }
          uVar18 = uVar18 >> 6;
          puVar25 = this->_pivots + (ulong)uVar22 + 1;
          uVar15 = uVar11;
          if ((uint)uVar18 == uVar22 >> 6) {
            for (; uVar15 < uVar12; uVar15 = uVar15 + 1) {
              if ((*puVar25 < uVar7) &&
                 (uVar9 = (uint)(this->_ge_matrix[uVar18 + (uint)*puVar25 * this->_ge_pitch] >>
                                uVar26) & uVar23 - 1, uVar9 != 0)) {
                gf256_add_mem(this->_recovery_blocks +
                              (uint)this->_ge_col_map[uVar15] * this->_block_bytes,win_table[uVar9],
                              this->_block_bytes);
              }
              puVar25 = puVar25 + 1;
            }
          }
          else {
            for (; uVar15 < uVar12; uVar15 = uVar15 + 1) {
              if ((*puVar25 < uVar7) &&
                 (uVar27 = (ulong)((uint)*puVar25 * this->_ge_pitch),
                 uVar22 = ((uint)(this->_ge_matrix[uVar18 + uVar27 + 1] <<
                                 ((ulong)(0x40 - (uVar9 & 0x3f)) & 0x3f)) |
                          (uint)(this->_ge_matrix[uVar18 + uVar27] >> uVar26)) & uVar23 - 1,
                 uVar22 != 0)) {
                gf256_add_mem(this->_recovery_blocks +
                              (uint)this->_ge_col_map[uVar15] * this->_block_bytes,win_table[uVar22]
                              ,this->_block_bytes);
              }
              puVar25 = puVar25 + 1;
            }
          }
          uVar18 = uVar11;
        } while (uVar8 < uVar21);
        uVar8 = uVar12 - uVar8;
        iVar10 = -0x5b;
        uVar17 = 6;
        if (uVar8 < 0x5b) {
          iVar10 = -0x46;
          uVar17 = 5;
          if (uVar8 < 0x46) {
            iVar10 = -0x31;
            uVar17 = 4;
            if (uVar8 < 0x31) break;
          }
        }
        uVar21 = uVar8 + iVar10;
        uVar23 = 1 << uVar17;
      } while( true );
    }
  }
  uVar18 = uVar11;
LAB_001046ab:
  uVar17 = (int)uVar18 + 1;
  uVar18 = (ulong)uVar17;
  if (uVar12 <= uVar17) {
    return;
  }
  uVar15 = (ulong)uVar17;
  uVar7 = this->_ge_col_map[uVar15];
  uVar1 = this->_pivots[uVar15];
  uVar9 = this->_block_bytes;
  puVar14 = this->_recovery_blocks;
  if (uVar13 <= uVar1) goto code_r0x001046e8;
  goto LAB_00104766;
code_r0x001046e8:
  uVar21 = (uint)uVar1 - (uint)uVar13;
  uVar8 = this->_heavy_pitch;
  puVar16 = this->_heavy_matrix;
  for (uVar26 = (ulong)this->_first_heavy_column; uVar26 < uVar15; uVar26 = uVar26 + 1) {
    if (puVar16[(ulong)((int)uVar26 - this->_first_heavy_column) +
                (ulong)((uVar21 & 0xffff) * uVar8)] != '\0') {
      gf256_muladd_mem(puVar14 + uVar7 * uVar9,
                       puVar16[(ulong)((int)uVar26 - this->_first_heavy_column) +
                               (ulong)((uVar21 & 0xffff) * uVar8)],
                       this->_recovery_blocks + (uint)this->_ge_col_map[uVar26] * this->_block_bytes
                       ,this->_block_bytes);
    }
  }
  if ((ushort)uVar21 < this->_extra_count) {
    uVar15 = (ulong)this->_first_heavy_column;
    if (uVar17 < this->_first_heavy_column) {
      uVar15 = uVar18;
    }
LAB_00104766:
    uVar17 = this->_ge_pitch;
    puVar4 = this->_ge_matrix;
    uVar26 = 1L << (uVar11 & 0x3f);
    for (uVar27 = uVar11; uVar27 < uVar15; uVar27 = uVar27 + 1) {
      if ((puVar4[(ulong)(uVar1 * uVar17) + (uVar27 >> 6 & 0x3ffffff)] & uVar26) != 0) {
        gf256_add_mem(puVar14 + uVar7 * uVar9,
                      this->_recovery_blocks + (uint)this->_ge_col_map[uVar27] * this->_block_bytes,
                      this->_block_bytes);
      }
      uVar26 = uVar26 >> 0x3f | uVar26 << 1;
    }
  }
  goto LAB_001046ab;
}

Assistant:

void Codec::AddSubdiagonalValues()
{
    CAT_IF_DUMP(cout << endl << "---- AddSubdiagonalValues ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0; unsigned heavyops = 0;)

    const unsigned column_count = _defer_count + _mix_count;
    unsigned pivot_i = 0;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

#if defined(CAT_WINDOWED_LOWERTRI)
    const uint16_t first_non_binary_row = first_heavy_row + _extra_count;

    // Build temporary storage space if windowing is to be used
    if (column_count >= CAT_UNDER_WIN_THRESH_5)
    {
        unsigned w, next_check_i;

        // Calculate initial window size
        if (column_count >= CAT_UNDER_WIN_THRESH_7)
        {
            w = 7;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_7;
        }
        else if (column_count >= CAT_UNDER_WIN_THRESH_6)
        {
            w = 6;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_6;
        }
        else if (column_count >= CAT_UNDER_WIN_THRESH_5)
        {
            w = 5;
            next_check_i = column_count - CAT_UNDER_WIN_THRESH_5;
        }
        else
        {
            w = 4;
            next_check_i = CAT_UNDER_WIN_THRESH_4;
        }
        uint32_t win_lim = 1 << w;

        CAT_IF_DUMP(cout << "Activating windowed lower triangular elimination with initial window " << w << endl;)

        // Use the first few peel column values as window table space
        // Note that the peeled column values were previously used up until this point,
        // but now they are unused, and so they can be reused for temporary space
        uint8_t * GF256_RESTRICT win_table[128];
        const PeelColumn * GF256_RESTRICT column = _peel_cols;
        uint8_t * GF256_RESTRICT column_src = _recovery_blocks;
        uint32_t jj = 1;

        for (uint32_t count = _block_count; count > 0; --count, ++column, column_src += _block_bytes)
        {
            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                // Reuse the block value temporarily as window table space
                win_table[jj] = column_src;

                CAT_IF_DUMP(cout << "-- Window table entry " << jj << " set to column " << _block_count - count << endl;)

                // If done:
                if (++jj >= win_lim) {
                    break;
                }
            }
        }

        CAT_IF_DUMP(if (jj < win_lim) {
            cout << "!! Not enough space in peeled columns to generate a table.  " \
                "Going back to normal lower triangular elimination." << endl;
        })

        // If enough space was found:
        if (jj >= win_lim) for (;;)
        {
            // Calculate first column in window
            const unsigned final_i = pivot_i + w - 1;

            CAT_IF_DUMP(cout << "-- Windowing from " << pivot_i << " to " << final_i << " (inclusive)" << endl;)

            // Eliminate lower triangular part below windowed bits:

            uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

            // For each column:
            for (unsigned src_pivot_i = pivot_i; src_pivot_i < final_i; ++src_pivot_i)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[src_pivot_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[src_pivot_i];

                CAT_IF_DUMP(cout << "Back-substituting small triangle from pivot " << src_pivot_i << "[" << (unsigned)src[0] << "] :";)

                const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (src_pivot_i >> 6);

                // For each row above the diagonal:
                for (unsigned dest_pivot_i = src_pivot_i + 1; dest_pivot_i <= final_i; ++dest_pivot_i)
                {
                    // If row is heavy:
                    const uint16_t dest_row_i = _pivots[dest_pivot_i];

                    // If bit is set in that row:
                    if (ge_row[_ge_pitch * dest_row_i] & ge_mask)
                    {
                        const uint16_t dest_col_i = _ge_col_map[dest_pivot_i];
                        CAT_DEBUG_ASSERT(dest_col_i < _block_count + _mix_count);

                        CAT_DEBUG_ASSERT(dest_col_i < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_col_i;

                        // Back-substitute
                        gf256_add_mem(dest, src, _block_bytes);

                        CAT_IF_ROWOP(++rowops;)

                        CAT_IF_DUMP(cout << " " << dest_pivot_i;)
                    }
                } // next pivot above

                CAT_IF_DUMP(cout << endl;)

                ge_mask = CAT_ROL64(ge_mask, 1);
            } // next pivot

            CAT_IF_DUMP(cout << "-- Generating window table with " << w << " bits" << endl;)

            // Generate window table: 2 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i] < _recovery_rows);
            win_table[1] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i];
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 1] < _recovery_rows);
            win_table[2] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 1];
            gf256_addset_mem(win_table[3], win_table[1], win_table[2], _block_bytes);
            CAT_IF_ROWOP(++rowops;)

            // Generate window table: 3 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 2] < _recovery_rows);
            win_table[4] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 2];
            gf256_addset_mem(win_table[5], win_table[1], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[6], win_table[2], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[7], win_table[1], win_table[6], _block_bytes);
            CAT_IF_ROWOP(rowops += 3;)

            // Generate window table: 4 bits
            CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 3] < _recovery_rows);
            win_table[8] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 3];
            for (unsigned ii = 1; ii < 8; ++ii) {
                gf256_addset_mem(win_table[8 + ii], win_table[ii], win_table[8], _block_bytes);
            }
            CAT_IF_ROWOP(rowops += 7;)

            // Generate window table: 5+ bits
            if (w >= 5)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 4] < _recovery_rows);
                win_table[16] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 4];
                for (unsigned ii = 1; ii < 16; ++ii) {
                    gf256_addset_mem(win_table[16 + ii], win_table[ii], win_table[16], _block_bytes);
                }
                CAT_IF_ROWOP(rowops += 15;)

                if (w >= 6)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 5] < _recovery_rows);
                    win_table[32] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 5];
                    for (unsigned ii = 1; ii < 32; ++ii) {
                        gf256_addset_mem(win_table[32 + ii], win_table[ii], win_table[32], _block_bytes);
                    }
                    CAT_IF_ROWOP(rowops += 31;)

                    if (w >= 7)
                    {
                        CAT_DEBUG_ASSERT(_ge_col_map[pivot_i + 6] < _recovery_rows);
                        win_table[64] = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i + 6];
                        for (unsigned ii = 1; ii < 64; ++ii) {
                            gf256_addset_mem(win_table[64 + ii], win_table[ii], win_table[64], _block_bytes);
                        }
                        CAT_IF_ROWOP(rowops += 63;)
                    }
                }
            }

            const unsigned first_word = pivot_i >> 6;
            const unsigned shift0 = pivot_i & 63;
            const unsigned last_word = final_i >> 6;
            const uint16_t * GF256_RESTRICT pivot_row = _pivots + final_i + 1;

            // If not straddling words:
            if (first_word == last_word)
            {
                // For each pivot row:
                for (unsigned ge_below_i = final_i + 1; ge_below_i < column_count; ++ge_below_i)
                {
                    const uint16_t ge_row_i = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_i >= first_non_binary_row) {
                        continue;
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_i;
                    const unsigned win_bits = (uint32_t)(ge_row[0] >> shift0) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << ge_below_i << endl;)

                        // Back-substitute
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_below_i];
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);
                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }
            else // Rare: Straddling case
            {
                const unsigned shift1 = 64 - shift0;

                // For each pivot row:
                for (unsigned ge_below_i = final_i + 1; ge_below_i < column_count; ++ge_below_i)
                {
                    // If pivot row is heavy:
                    const uint16_t ge_row_i = *pivot_row++;
                    if (ge_row_i >= first_non_binary_row) {
                        continue;
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_i;
                    const uint32_t win_bits = ( (uint32_t)(ge_row[0] >> shift0) | (uint32_t)(ge_row[1] << shift1) ) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << ge_below_i << endl;)

                        // Back-substitute
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_below_i];
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);
                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }

            // If column index falls below window size:
            pivot_i += w;
            if (pivot_i >= next_check_i)
            {
                CAT_DEBUG_ASSERT(pivot_i < column_count);
                const unsigned remaining_columns = column_count - pivot_i;

                if (remaining_columns >= CAT_UNDER_WIN_THRESH_6) {
                    w = 6;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_6;
                }
                else if (remaining_columns >= CAT_UNDER_WIN_THRESH_5) {
                    w = 5;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_5;
                }
                else if (remaining_columns >= CAT_UNDER_WIN_THRESH_4) {
                    w = 4;
                    next_check_i = remaining_columns - CAT_UNDER_WIN_THRESH_4;
                }
                else {
                    break;
                }

                // Update window limit
                win_lim = 1 << w;
            }
        } // next window
    } // end if windowed
#endif // CAT_WINDOWED_LOWERTRI

    // For each row to eliminate:
    for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
    {
        // Lookup pivot column, GE row, and destination buffer
        const unsigned column_i = _ge_col_map[ge_column_i];
        const uint16_t ge_row_i = _pivots[ge_column_i];
        CAT_DEBUG_ASSERT(column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * column_i;

        CAT_IF_DUMP(cout << "Pivot " << ge_column_i << " solving column " << column_i << "[" << (unsigned)dest[0] << "] with GE row " << ge_row_i << " :";)

        unsigned ge_limit = ge_column_i;

        // If row is heavy or extra:
        if (ge_row_i >= first_heavy_row)
        {
            const uint16_t heavy_row_i = ge_row_i - first_heavy_row;

            // For each column up to the diagonal:
            const uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;
            for (unsigned sub_i = _first_heavy_column; sub_i < ge_limit; ++sub_i)
            {
                // If column is zero:
                const uint8_t code_value = heavy_row[sub_i - _first_heavy_column];
                if (0 == code_value) {
                    continue; // Skip it
                }

                // Look up data source
                CAT_DEBUG_ASSERT(_ge_col_map[sub_i] < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[sub_i];

                gf256_muladd_mem(dest, code_value, src, _block_bytes);

                CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                CAT_IF_DUMP(cout << " h" << ge_column_i << "=[" << (unsigned)src[0] << "*" << (unsigned)code_value << "]";)
            }

            // If row is not extra:
            if (heavy_row_i >= _extra_count) {
                CAT_IF_DUMP(cout << endl;)
                continue; // Skip binary matrix elimination
            }

            // Limit the binary matrix elimination to non-heavy columns
            if (ge_limit > _first_heavy_column) {
                ge_limit = _first_heavy_column;
            }

            // fall-thru..
        }

        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * ge_row_i;
        uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

        // For each GE matrix bit in the row:
        for (unsigned bit_j = pivot_i; bit_j < ge_limit; ++bit_j)
        {
            // If bit is non-zero:
            if (0 != (ge_row[bit_j >> 6] & ge_mask))
            {
                const unsigned column_j = _ge_col_map[bit_j];
                CAT_DEBUG_ASSERT(column_j < _recovery_rows);
                const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * column_j;

                // Add pivot for non-zero bit to destination row value
                gf256_add_mem(dest, src, _block_bytes);
                CAT_IF_ROWOP(++rowops;)

                CAT_IF_DUMP(cout << " " << bit_j << "=[" << (unsigned)src[0] << "]";)
            }

            ge_mask = CAT_ROL64(ge_mask, 1);
        }

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "AddSubdiagonalValues used " << rowops << " row ops = " << rowops / (double)_block_count << "*N and " << heavyops << " heavy ops" << endl;)
}